

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O1

void nni_posix_pfd_close(nni_posix_pfd *pfd)

{
  nni_posix_pollq *pnVar1;
  _Bool _Var2;
  undefined1 local_24 [8];
  epoll_event ev;
  
  pnVar1 = pfd->pq;
  if (pnVar1 != (nni_posix_pollq *)0x0) {
    _Var2 = nni_atomic_flag_test_and_set(&pfd->closing);
    if (!_Var2) {
      shutdown(pfd->fd,2);
      epoll_ctl(pnVar1->epfd,2,pfd->fd,(epoll_event *)local_24);
    }
  }
  return;
}

Assistant:

void
nni_posix_pfd_close(nni_posix_pfd *pfd)
{
	nni_posix_pollq *pq = pfd->pq;
	if (pq == NULL) {
		return;
	}
	if (nni_atomic_flag_test_and_set(&pfd->closing)) {
		return;
	}

	struct epoll_event ev; // Not actually used.

	(void) shutdown(pfd->fd, SHUT_RDWR);
	(void) epoll_ctl(pq->epfd, EPOLL_CTL_DEL, pfd->fd, &ev);
}